

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::SerializeWithCachedSizes
          (ResizeBilinearLayerParams *this,CodedOutputStream *output)

{
  uint64 value;
  int index;
  int iVar1;
  
  iVar1 = (this->targetsize_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_targetsize_cached_byte_size_);
    iVar1 = (this->targetsize_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value = targetsize(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  if (this != (ResizeBilinearLayerParams *)&_ResizeBilinearLayerParams_default_instance_ &&
      this->mode_ != (SamplingMode *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->mode_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ResizeBilinearLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ResizeBilinearLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 targetSize = 1;
  if (this->targetsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_targetsize_cached_byte_size_);
  }
  for (int i = 0, n = this->targetsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->targetsize(i), output);
  }

  // .CoreML.Specification.SamplingMode mode = 2;
  if (this->has_mode()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->mode_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ResizeBilinearLayerParams)
}